

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode hostname_check(Curl_URL *u,char *hostname)

{
  char cVar1;
  CURLUcode CVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  char zoneid [16];
  
  sVar3 = strlen(hostname);
  pcVar7 = hostname + 1;
  if (*hostname == '[') {
    sVar4 = strspn(pcVar7,"0123456789abcdefABCDEF::.");
    hostname = pcVar7;
    if (sVar3 - 2 != sVar4) {
      if (pcVar7[sVar4] != '%') {
        return CURLUE_MALFORMED_INPUT;
      }
      pcVar7 = pcVar7 + sVar4;
      pcVar5 = pcVar7 + 1;
      if ((((pcVar7[1] == '2') && (pcVar7[2] == '5')) && (pcVar7[3] != '\0')) && (pcVar7[3] != ']'))
      {
        pcVar5 = pcVar7 + 3;
      }
      uVar6 = 0;
      while( true ) {
        cVar1 = pcVar5[uVar6];
        if (cVar1 == '\0') {
          return CURLUE_MALFORMED_INPUT;
        }
        if ((cVar1 == ']') || (0xe < uVar6)) break;
        zoneid[uVar6] = cVar1;
        uVar6 = uVar6 + 1;
      }
      if (uVar6 == 0) {
        return CURLUE_MALFORMED_INPUT;
      }
      if (cVar1 != ']') {
        return CURLUE_MALFORMED_INPUT;
      }
      zoneid[uVar6] = '\0';
      pcVar5 = (*Curl_cstrdup)(zoneid);
      u->zoneid = pcVar5;
      if (pcVar5 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      pcVar7[0] = ']';
      pcVar7[1] = '\0';
    }
  }
  else {
    sVar4 = strcspn(hostname," ");
    if (sVar3 != sVar4) {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  CVar2 = CURLUE_NO_HOST;
  if (*hostname != '\0') {
    CVar2 = CURLUE_OK;
  }
  return CVar2;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname)
{
  const char *l = NULL; /* accepted characters */
  size_t len;
  size_t hlen = strlen(hostname);

  if(hostname[0] == '[') {
    hostname++;
    l = "0123456789abcdefABCDEF::.";
    hlen -= 2;
  }

  if(l) {
    /* only valid letters are ok */
    len = strspn(hostname, l);
    if(hlen != len) {
      if(hostname[len] == '%') {
        /* this could now be '%[zone id]' */
        char zoneid[16];
        int i = 0;
        char *h = &hostname[len + 1];
        /* pass '25' if present and is a url encoded percent sign */
        if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
          h += 2;
        while(*h && (*h != ']') && (i < 15))
          zoneid[i++] = *h++;
        if(!i || (']' != *h))
          return CURLUE_MALFORMED_INPUT;
        zoneid[i] = 0;
        u->zoneid = strdup(zoneid);
        if(!u->zoneid)
          return CURLUE_OUT_OF_MEMORY;
        hostname[len] = ']'; /* insert end bracket */
        hostname[len + 1] = 0; /* terminate the hostname */
      }
      else
        return CURLUE_MALFORMED_INPUT;
      /* hostname is fine */
    }
  }
  else {
    /* letters from the second string is not ok */
    len = strcspn(hostname, " ");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_MALFORMED_INPUT;
  }
  if(!hostname[0])
    return CURLUE_NO_HOST;
  return CURLUE_OK;
}